

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O3

void __thiscall QtMWidgets::ScrollAreaPrivate::updateWidgetPosition(ScrollAreaPrivate *this)

{
  QPoint QVar1;
  long lVar2;
  QPoint *pQVar3;
  LayoutDirection LVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QPoint *pQVar7;
  int iVar8;
  int iVar9;
  QRect local_58;
  QRect local_48;
  
  LVar4 = QWidget::layoutDirection();
  lVar2 = *(long *)((this->super_AbstractScrollAreaPrivate).viewport + 0x20);
  local_58.x2 = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  local_58.y2 = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  local_58.x1 = 0;
  local_58.y1 = 0;
  QVar1 = (this->super_AbstractScrollAreaPrivate).topLeftCorner;
  lVar2 = *(long *)((this->widget).wp.value + 0x20);
  uVar5 = *(undefined8 *)(lVar2 + 0x1c);
  uVar6 = *(undefined8 *)(lVar2 + 0x14);
  iVar8 = QVar1.xp;
  iVar9 = QVar1.yp;
  local_48.x2 = (int)uVar5 - ((int)uVar6 + iVar8);
  local_48.y2 = (int)((ulong)uVar5 >> 0x20) - ((int)((ulong)uVar6 >> 0x20) + iVar9);
  local_48.y1 = -iVar9;
  local_48.x1 = -iVar8;
  uVar5 = QStyle::visualRect(LVar4,&local_58,&local_48);
  lVar2 = *(long *)((this->widget).wp.value + 0x20);
  local_48.x1 = (*(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14)) + 1;
  local_48.y1 = (*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1;
  lVar2 = *(long *)((this->super_AbstractScrollAreaPrivate).viewport + 0x20);
  local_58.x2 = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  local_58.y2 = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  local_58.x1 = 0;
  local_58.y1 = 0;
  uVar6 = QStyle::alignedRect(LVar4,(this->alignment).i,&local_48,&local_58);
  pQVar3 = (QPoint *)(this->widget).wp.value;
  pQVar7 = (QPoint *)0x0;
  if ((((this->widget).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i != 0) {
    pQVar7 = pQVar3;
  }
  QVar1 = pQVar3[4];
  lVar2 = *(long *)((this->super_AbstractScrollAreaPrivate).viewport + 0x20);
  local_58.x1 = (int)uVar5;
  if ((*(int *)((long)QVar1 + 0x1c) - *(int *)((long)QVar1 + 0x14)) + 1 <
      (*(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14)) + 1) {
    local_58.x1 = (int)uVar6;
  }
  if ((*(int *)((long)QVar1 + 0x20) - *(int *)((long)QVar1 + 0x18)) + 1 <
      (*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1) {
    uVar5 = uVar6;
  }
  local_58.y1 = (int)((ulong)uVar5 >> 0x20);
  QWidget::move(pQVar7);
  return;
}

Assistant:

void
ScrollAreaPrivate::updateWidgetPosition()
{
	ScrollArea * q = q_func();

	const Qt::LayoutDirection dir = q->layoutDirection();

	const QRect scrolled = QStyle::visualRect( dir, viewport->rect(),
		QRect( QPoint( -topLeftCorner.x(), -topLeftCorner.y() ), widget->size() ) );
	const QRect aligned = QStyle::alignedRect( dir, alignment, widget->size(),
		viewport->rect() );

	widget->move( widget->width() < viewport->width() ? aligned.x() : scrolled.x(),
		widget->height() < viewport->height() ? aligned.y() : scrolled.y() );
}